

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::GetNavInputAmount(ImGuiNavInput n,ImGuiInputReadMode mode)

{
  float t_00;
  int iVar1;
  int in_ESI;
  int in_EDI;
  float t;
  ImGuiContext *g;
  float local_4;
  
  if (in_ESI == 0) {
    local_4 = (GImGui->IO).NavInputs[in_EDI];
  }
  else {
    t_00 = (GImGui->IO).NavInputsDownDuration[in_EDI];
    if ((0.0 <= t_00) || (in_ESI != 2)) {
      if (0.0 <= t_00) {
        if (in_ESI == 1) {
          local_4 = (float)(-(uint)(t_00 == 0.0) & 0x3f800000);
        }
        else if (in_ESI == 3) {
          iVar1 = CalcTypematicPressedRepeatAmount
                            (t_00,t_00 - (GImGui->IO).DeltaTime,(GImGui->IO).KeyRepeatDelay * 0.8,
                             (GImGui->IO).KeyRepeatRate * 0.8);
          local_4 = (float)iVar1;
        }
        else if (in_ESI == 4) {
          iVar1 = CalcTypematicPressedRepeatAmount
                            (t_00,t_00 - (GImGui->IO).DeltaTime,(GImGui->IO).KeyRepeatDelay * 1.0,
                             (GImGui->IO).KeyRepeatRate * 2.0);
          local_4 = (float)iVar1;
        }
        else if (in_ESI == 5) {
          iVar1 = CalcTypematicPressedRepeatAmount
                            (t_00,t_00 - (GImGui->IO).DeltaTime,(GImGui->IO).KeyRepeatDelay * 0.8,
                             (GImGui->IO).KeyRepeatRate * 0.3);
          local_4 = (float)iVar1;
        }
        else {
          local_4 = 0.0;
        }
      }
      else {
        local_4 = 0.0;
      }
    }
    else {
      local_4 = (float)(-(uint)(0.0 <= (GImGui->IO).NavInputsDownDurationPrev[in_EDI]) & 0x3f800000)
      ;
    }
  }
  return local_4;
}

Assistant:

float ImGui::GetNavInputAmount(ImGuiNavInput n, ImGuiInputReadMode mode)
{
    ImGuiContext& g = *GImGui;
    if (mode == ImGuiInputReadMode_Down)
        return g.IO.NavInputs[n];                         // Instant, read analog input (0.0f..1.0f, as provided by user)

    const float t = g.IO.NavInputsDownDuration[n];
    if (t < 0.0f && mode == ImGuiInputReadMode_Released)  // Return 1.0f when just released, no repeat, ignore analog input.
        return (g.IO.NavInputsDownDurationPrev[n] >= 0.0f ? 1.0f : 0.0f);
    if (t < 0.0f)
        return 0.0f;
    if (mode == ImGuiInputReadMode_Pressed)               // Return 1.0f when just pressed, no repeat, ignore analog input.
        return (t == 0.0f) ? 1.0f : 0.0f;
    if (mode == ImGuiInputReadMode_Repeat)
        return (float)CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay * 0.80f, g.IO.KeyRepeatRate * 0.80f);
    if (mode == ImGuiInputReadMode_RepeatSlow)
        return (float)CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay * 1.00f, g.IO.KeyRepeatRate * 2.00f);
    if (mode == ImGuiInputReadMode_RepeatFast)
        return (float)CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay * 0.80f, g.IO.KeyRepeatRate * 0.30f);
    return 0.0f;
}